

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O3

void FACT_INTERNAL_UpdateEngine(FACTAudioEngine *engine)

{
  int iVar1;
  FACTRPC *pFVar2;
  long lVar3;
  FACTDSPParameter *pFVar4;
  char cVar5;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [16];
  undefined6 uVar18;
  undefined8 uVar19;
  unkbyte10 Var20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined4 uVar23;
  float fVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  ushort uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float local_64;
  undefined4 local_60;
  undefined8 local_5c;
  undefined4 local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  char cVar6;
  char cVar7;
  char cVar8;
  
  uVar28 = engine->rpcCount;
  if (uVar28 != 0) {
    uVar32 = 0;
    do {
      if (((4 < engine->rpcs[uVar32].parameter) &&
          ((engine->variables[engine->rpcs[uVar32].variable].accessibility & 4) == 0)) &&
         (engine->dspPresetCount != 0)) {
        lVar30 = 8;
        uVar31 = 0;
        do {
          pFVar2 = engine->rpcs;
          iVar1 = *(int *)&pFVar2[uVar32].parameter;
          fVar24 = FACT_INTERNAL_CalculateRPC
                             (pFVar2 + uVar32,engine->globalVariableValues[pFVar2[uVar32].variable])
          ;
          lVar3 = *(long *)(&engine->dspPresets->accessibility + lVar30);
          uVar29 = (ulong)(iVar1 - 5U & 0xffff);
          fVar36 = *(float *)(lVar3 + 0xc + uVar29 * 0x14);
          if ((fVar24 <= fVar36) &&
             (fVar36 = *(float *)(lVar3 + uVar29 * 0x14 + 8), fVar36 <= fVar24)) {
            fVar36 = fVar24;
          }
          *(float *)(lVar3 + 4 + uVar29 * 0x14) = fVar36;
          uVar31 = uVar31 + 1;
          lVar30 = lVar30 + 0x10;
        } while (uVar31 < engine->dspPresetCount);
        uVar28 = engine->rpcCount;
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 < uVar28);
  }
  if (engine->reverbVoice != (FAudioVoice *)0x0) {
    pFVar4 = engine->dspPresets->parameters;
    local_64 = pFVar4[0x15].value;
    local_60 = (undefined4)(long)pFVar4->value;
    iVar1 = (int)pFVar4[5].value;
    iVar25 = (int)pFVar4[6].value;
    iVar26 = (int)pFVar4[7].value;
    auVar37._0_4_ = (int)pFVar4[1].value;
    auVar37._4_4_ = (int)pFVar4[0xc].value;
    auVar37._8_4_ = (int)pFVar4[2].value;
    auVar37._12_4_ = (int)pFVar4[3].value;
    auVar38[4] = (char)iVar1;
    auVar38._0_4_ = (int)pFVar4[4].value;
    auVar38[5] = (char)((uint)iVar1 >> 8);
    auVar38[6] = (char)((uint)iVar1 >> 0x10);
    auVar38[7] = (char)((uint)iVar1 >> 0x18);
    auVar38[8] = (char)iVar25;
    auVar38[9] = (char)((uint)iVar25 >> 8);
    auVar38[10] = (char)((uint)iVar25 >> 0x10);
    auVar38[0xb] = (char)((uint)iVar25 >> 0x18);
    auVar38[0xc] = (char)iVar26;
    auVar38[0xd] = (char)((uint)iVar26 >> 8);
    auVar38[0xe] = (char)((uint)iVar26 >> 0x10);
    auVar38[0xf] = (char)((uint)iVar26 >> 0x18);
    auVar38 = packssdw(auVar37,auVar38);
    sVar9 = auVar38._0_2_;
    sVar10 = auVar38._2_2_;
    sVar11 = auVar38._4_2_;
    sVar12 = auVar38._6_2_;
    sVar13 = auVar38._8_2_;
    sVar14 = auVar38._10_2_;
    sVar15 = auVar38._12_2_;
    sVar16 = auVar38._14_2_;
    local_5c = CONCAT17((0 < sVar16) * (sVar16 < 0x100) * auVar38[0xe] - (0xff < sVar16),
                        CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar38[0xc] - (0xff < sVar15),
                                 CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar38[10] -
                                          (0xff < sVar14),
                                          CONCAT14((0 < sVar13) * (sVar13 < 0x100) * auVar38[8] -
                                                   (0xff < sVar13),
                                                   CONCAT13((0 < sVar12) * (sVar12 < 0x100) *
                                                            auVar38[6] - (0xff < sVar12),
                                                            CONCAT12((0 < sVar11) * (sVar11 < 0x100)
                                                                     * auVar38[4] - (0xff < sVar11),
                                                                     CONCAT11((0 < sVar10) *
                                                                              (sVar10 < 0x100) *
                                                                              auVar38[2] -
                                                                              (0xff < sVar10),
                                                                              (0 < sVar9) *
                                                                              (sVar9 < 0x100) *
                                                                              auVar38[0] -
                                                                              (0xff < sVar9))))))));
    fVar36 = pFVar4[0xb].value;
    iVar1 = (int)pFVar4[8].value;
    iVar25 = (int)pFVar4[9].value;
    cVar33 = (char)((uint)iVar25 >> 0x10);
    iVar26 = (int)pFVar4[10].value;
    cVar34 = (char)((uint)iVar26 >> 0x10);
    iVar27 = (int)(float)(CONCAT17((char)((uint)fVar36 >> 0x18),
                                   CONCAT16((char)((uint)fVar36 >> 0x10),
                                            CONCAT15((char)((uint)fVar36 >> 8),
                                                     CONCAT14(SUB41(fVar36,0),pFVar4[10].value))))
                         >> 0x20);
    cVar35 = (char)((uint)iVar27 >> 0x10);
    uVar18 = CONCAT15((char)((uint)iVar25 >> 8),CONCAT14((char)iVar25,iVar1));
    uVar19 = CONCAT17((char)((uint)iVar25 >> 0x18),CONCAT16(cVar33,uVar18));
    Var20 = CONCAT19((char)((uint)iVar26 >> 8),CONCAT18((char)iVar26,uVar19));
    auVar21[10] = cVar34;
    auVar21._0_10_ = Var20;
    auVar21[0xb] = (char)((uint)iVar26 >> 0x18);
    auVar22[0xc] = (char)iVar27;
    auVar22._0_12_ = auVar21;
    auVar22[0xd] = (char)((uint)iVar27 >> 8);
    auVar17[0xe] = cVar35;
    auVar17._0_14_ = auVar22;
    auVar17[0xf] = (char)((uint)iVar27 >> 0x18);
    sVar9 = (short)iVar1;
    cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar1 - (0xff < sVar9);
    sVar9 = (short)((uint)iVar1 >> 0x10);
    sVar10 = (short)((uint6)uVar18 >> 0x20);
    cVar6 = (0 < sVar10) * (sVar10 < 0x100) * (char)iVar25 - (0xff < sVar10);
    sVar10 = (short)((ulong)uVar19 >> 0x30);
    sVar11 = (short)((unkuint10)Var20 >> 0x40);
    cVar7 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar26 - (0xff < sVar11);
    sVar11 = auVar21._10_2_;
    sVar12 = auVar22._12_2_;
    cVar8 = (0 < sVar12) * (sVar12 < 0x100) * (char)iVar27 - (0xff < sVar12);
    sVar12 = auVar17._14_2_;
    sVar13 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * (char)((uint)iVar1 >> 0x10) - (0xff < sVar9),
                      cVar5);
    uVar23 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar33 - (0xff < sVar10),
                      CONCAT12(cVar6,sVar13));
    uVar18 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * cVar34 - (0xff < sVar11),
                      CONCAT14(cVar7,uVar23));
    sVar9 = (short)((uint)uVar23 >> 0x10);
    sVar10 = (short)((uint6)uVar18 >> 0x20);
    sVar11 = (short)(CONCAT17((0 < sVar12) * (sVar12 < 0x100) * cVar35 - (0xff < sVar12),
                              CONCAT16(cVar8,uVar18)) >> 0x30);
    local_54 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar8 - (0xff < sVar11),
                        CONCAT12((0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10),
                                 CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                                          (0 < sVar13) * (sVar13 < 0x100) * cVar5 - (0xff < sVar13))
                                ));
    local_4c = pFVar4[0xe].value;
    local_50 = pFVar4[0xd].value;
    local_48 = pFVar4[0xf].value;
    local_44 = pFVar4[0x10].value;
    local_40 = pFVar4[0x11].value;
    local_3c = pFVar4[0x12].value;
    local_38 = pFVar4[0x13].value;
    local_34 = pFVar4[0x14].value;
    FAudioVoice_SetEffectParameters(engine->reverbVoice,0,&local_64,0x34,0);
  }
  return;
}

Assistant:

void FACT_INTERNAL_UpdateEngine(FACTAudioEngine *engine)
{
	FAudioFXReverbParameters rvbPar;
	uint16_t i, j, par;
	float rpcResult;
	for (i = 0; i < engine->rpcCount; i += 1)
	{
		if (engine->rpcs[i].parameter >= RPC_PARAMETER_COUNT)
		{
			/* FIXME: Why did I make this global vars only...? */
			if (!(engine->variables[engine->rpcs[i].variable].accessibility & 0x04))
			{
				for (j = 0; j < engine->dspPresetCount; j += 1)
				{
					/* FIXME: This affects all DSP presets!
					 * What if there's more than one?
					 */
					par = engine->rpcs[i].parameter - RPC_PARAMETER_COUNT;
					rpcResult = FACT_INTERNAL_CalculateRPC(
						&engine->rpcs[i],
						engine->globalVariableValues[engine->rpcs[i].variable]
					);
					engine->dspPresets[j].parameters[par].value = FAudio_clamp(
						rpcResult,
						engine->dspPresets[j].parameters[par].minVal,
						engine->dspPresets[j].parameters[par].maxVal
					);
				}
			}
		}
	}

	/* Set Effect parameters from above RPC changes */
	if (engine->reverbVoice != NULL)
	{
		rvbPar.WetDryMix = engine->dspPresets[0].parameters[21].value;
		rvbPar.ReflectionsDelay = (uint32_t) engine->dspPresets[0].parameters[0].value;
		rvbPar.ReverbDelay = (uint8_t) engine->dspPresets[0].parameters[1].value;
		rvbPar.RearDelay = (uint8_t) engine->dspPresets[0].parameters[12].value;
		rvbPar.PositionLeft = (uint8_t) engine->dspPresets[0].parameters[2].value;
		rvbPar.PositionRight = (uint8_t) engine->dspPresets[0].parameters[3].value;
		rvbPar.PositionMatrixLeft = (uint8_t) engine->dspPresets[0].parameters[4].value;
		rvbPar.PositionMatrixRight = (uint8_t) engine->dspPresets[0].parameters[5].value;
		rvbPar.HighEQGain = (uint8_t) engine->dspPresets[0].parameters[10].value;
		rvbPar.LowEQCutoff = (uint8_t) engine->dspPresets[0].parameters[9].value;
		rvbPar.LowEQGain = (uint8_t) engine->dspPresets[0].parameters[8].value;
		rvbPar.LateDiffusion = (uint8_t) engine->dspPresets[0].parameters[7].value;
		rvbPar.EarlyDiffusion = (uint8_t) engine->dspPresets[0].parameters[6].value;
		rvbPar.HighEQCutoff = (uint8_t) engine->dspPresets[0].parameters[11].value;
		rvbPar.RoomFilterMain = engine->dspPresets[0].parameters[14].value;
		rvbPar.RoomFilterFreq = engine->dspPresets[0].parameters[13].value;
		rvbPar.RoomFilterHF = engine->dspPresets[0].parameters[15].value;
		rvbPar.ReflectionsGain = engine->dspPresets[0].parameters[16].value;
		rvbPar.ReverbGain = engine->dspPresets[0].parameters[17].value;
		rvbPar.DecayTime = engine->dspPresets[0].parameters[18].value;
		rvbPar.Density = engine->dspPresets[0].parameters[19].value;
		rvbPar.RoomSize = engine->dspPresets[0].parameters[20].value;

		FAudioVoice_SetEffectParameters(
			engine->reverbVoice,
			0,
			&rvbPar,
			sizeof(FAudioFXReverbParameters),
			0
		);
	}
}